

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall CGraphics_Threaded::Swap(CGraphics_Threaded *this)

{
  int iVar1;
  long in_FS_OFFSET;
  CSwapCommand Cmd;
  CSwapCommand local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_DoScreenshot == true) {
    iVar1 = (**(code **)(*(long *)this + 0x1a0))(this);
    if (iVar1 != 0) {
      ScreenshotDirect(this,this->m_aScreenshotName);
    }
    this->m_DoScreenshot = false;
  }
  local_28.super_CCommand.m_Cmd = 8;
  local_28.super_CCommand.m_pNext = (CCommand *)0x0;
  local_28.m_Finish = this->m_pConfig->m_GfxFinish;
  CCommandBuffer::AddCommand<CCommandBuffer::CSwapCommand>(this->m_pCommandBuffer,&local_28);
  KickCommandBuffer(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::Swap()
{
	// TODO: screenshot support
	if(m_DoScreenshot)
	{
		if(WindowActive())
			ScreenshotDirect(m_aScreenshotName);
		m_DoScreenshot = false;
	}

	// add swap command
	CCommandBuffer::CSwapCommand Cmd;
	Cmd.m_Finish = m_pConfig->m_GfxFinish;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the command buffer
	KickCommandBuffer();
}